

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_table.c
# Opt level: O1

int llmsset_rehash_bucket(llmsset_t_conflict dbs,uint64_t d_idx)

{
  ulong *puVar1;
  bool bVar2;
  long lVar3;
  ulong uVar4;
  uint64_t uVar5;
  uint64_t uVar6;
  ulong uVar7;
  int iVar8;
  uint64_t uVar9;
  ulong uVar10;
  ulong uVar11;
  bool bVar12;
  
  uVar5 = 0xcbf29ce484222325;
  uVar9 = *(uint64_t *)(dbs->data + d_idx * 0x10);
  uVar6 = *(uint64_t *)(dbs->data + d_idx * 0x10 + 8);
  if ((long)(dbs->bitmapc[d_idx >> 6] << (d_idx & 0x3f)) < 0) {
    uVar5 = (*dbs->hash_cb)(uVar9,uVar6,0xcbf29ce484222325);
  }
  else {
    lVar3 = 0;
    do {
      uVar5 = uVar5 ^ *(ulong *)((long)sylvan_tabhash_table + lVar3 + (uVar9 & 0xff) * 8);
      uVar9 = uVar9 >> 8;
      lVar3 = lVar3 + 0x800;
    } while ((int)lVar3 != 0x4000);
    lVar3 = 0;
    do {
      uVar5 = uVar5 ^ *(ulong *)(lVar3 + (uVar6 & 0xff) * 8 + 0x132330);
      uVar6 = uVar6 >> 8;
      lVar3 = lVar3 + 0x800;
    } while ((int)lVar3 != 0x4000);
  }
  uVar4 = uVar5 >> 0x11;
  uVar7 = uVar5 & 0xffffff0000000000;
  uVar10 = dbs->mask & uVar5;
  iVar8 = 0;
  uVar11 = uVar10;
  do {
    if (dbs->table[uVar11] == 0) {
      bVar2 = false;
      puVar1 = dbs->table + uVar11;
      LOCK();
      bVar12 = *puVar1 == 0;
      if (bVar12) {
        *puVar1 = uVar7 | d_idx;
      }
      UNLOCK();
      if (!bVar12) goto LAB_001142e7;
    }
    else {
LAB_001142e7:
      uVar11 = (ulong)((int)uVar11 + 1U & 7) | uVar11 & 0xfffffffffffffff8;
      bVar2 = true;
      if (uVar11 == uVar10) {
        iVar8 = iVar8 + 1;
        if (iVar8 == dbs->threshold) {
          LOCK();
          dbs->threshold = dbs->threshold + 1;
          UNLOCK();
        }
        uVar5 = uVar5 + (uVar4 & 0xfffffffffffffff0 | 8);
        uVar10 = dbs->mask & uVar5;
        uVar11 = uVar10;
      }
    }
    if (!bVar2) {
      return 1;
    }
  } while( true );
}

Assistant:

int
llmsset_rehash_bucket(const llmsset_t dbs, uint64_t d_idx)
{
    const uint64_t * const d_ptr = ((uint64_t*)dbs->data) + 2*d_idx;
    const uint64_t a = d_ptr[0];
    const uint64_t b = d_ptr[1];

    uint64_t hash_rehash = 14695981039346656037LLU;
    const int custom = is_custom_bucket(dbs, d_idx) ? 1 : 0;
    if (custom) hash_rehash = dbs->hash_cb(a, b, hash_rehash);
    else hash_rehash = sylvan_tabhash16(a, b, hash_rehash);
    const uint64_t step = (((hash_rehash >> 20) | 1) << 3);
    const uint64_t new_v = (hash_rehash & MASK_HASH) | d_idx;
    int i=0;

    uint64_t idx, last;
#if LLMSSET_MASK
    last = idx = hash_rehash & dbs->mask;
#else
    last = idx = hash_rehash % dbs->table_size;
#endif

    for (;;) {
        _Atomic(uint64_t)* bucket = &dbs->table[idx];
        uint64_t v = atomic_load_explicit(bucket, memory_order_acquire);
        if (v == 0 && atomic_compare_exchange_strong(bucket, &v, new_v)) return 1;

        // find next idx on probe sequence
        idx = (idx & CL_MASK) | ((idx+1) & CL_MASK_R);
        if (idx == last) {
            if (++i == atomic_load_explicit(&dbs->threshold, memory_order_relaxed)) {
                // failed to find empty spot in probe sequence
                // solution: increase probe sequence length...
                atomic_fetch_add(&dbs->threshold, 1);
            }

            // go to next cache line in probe sequence
            hash_rehash += step;

#if LLMSSET_MASK
            last = idx = hash_rehash & dbs->mask;
#else
            last = idx = hash_rehash % dbs->table_size;
#endif
        }
    }
}